

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Performance::anon_unknown_1::ReferenceRenderTimeCase::init
          (ReferenceRenderTimeCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  DrawMethod DVar1;
  int iVar2;
  int numBytes;
  int numBytes_00;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  DVar1 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
          m_drawMethod;
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::init
            (&this->
              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,
             ctx);
  local_1a0._0_8_ =
       ((this->super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
        ).super_RenderPerformanceTestBase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Measuring the time used in ",0x1b);
  bVar5 = DVar1 != DRAWMETHOD_DRAW_ARRAYS;
  pcVar4 = "Draw method: drawElements";
  if (!bVar5) {
    pcVar4 = "Draw method: drawArrays";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,pcVar4 + 0xd,(ulong)bVar5 * 2 + 10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," and readPixels call with different rendering workloads.\n",0x39);
  std::ostream::operator<<
            (this_00,(int)((ulong)((long)(this->
                                         super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                                         ).m_results.
                                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->
                                        super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                                        ).m_results.
                                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     0x38e38e39);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," test samples. Sample order is randomized.\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
             ,0x56);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Generated workload is multiple viewport-covering grids with varying number of cells, each cell is two separate triangles.\n"
             ,0x7a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Workload sizes are in the range [",0x21);
  iVar2 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::
          getMinWorkloadSize(&this->
                              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                            );
  std::ostream::operator<<(this_00,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",  ",3);
  iVar2 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::
          getMaxWorkloadSize(&this->
                              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                            );
  std::ostream::operator<<(this_00,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"] vertices ([",0xd);
  iVar2 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::
          getMinWorkloadSize(&this->
                              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                            );
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1c0,(_anonymous_namespace_ *)(ulong)(uint)(iVar2 << 5),numBytes);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
  iVar2 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::
          getMaxWorkloadSize(&this->
                              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
                            );
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1e0,(_anonymous_namespace_ *)(ulong)(uint)(iVar2 << 5),numBytes_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"] to be processed).\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Test result is the approximated total processing rate in MiB / s.\n",0x42);
  lVar3 = 0;
  pcVar4 = glcts::fixed_sample_locations_values + 1;
  if ((this->super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>).
      m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    pcVar4 = "Note that index array size is not included in the processed size.\n";
    lVar3 = 0x42;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Note! Test result should only be used as a baseline reference result for buffer.data_upload.* test group results."
             ,0x71);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  iVar2 = std::ios_base::~ios_base(local_128);
  return iVar2;
}

Assistant:

void ReferenceRenderTimeCase::init (void)
{
	const char* const targetFunctionName = (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) ? ("drawArrays") : ("drawElements");

	// init parent
	RenderCase<RenderReadDuration>::init();

	// log
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Measuring the time used in " << targetFunctionName << " and readPixels call with different rendering workloads.\n"
		<< getNumSamples() << " test samples. Sample order is randomized.\n"
		<< "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
		<< "Generated workload is multiple viewport-covering grids with varying number of cells, each cell is two separate triangles.\n"
		<< "Workload sizes are in the range ["
			<< getMinWorkloadSize() << ",  "
			<< getMaxWorkloadSize() << "] vertices (["
			<< getHumanReadableByteSize(getMinWorkloadDataSize()) << ","
			<< getHumanReadableByteSize(getMaxWorkloadDataSize()) << "] to be processed).\n"
		<< "Test result is the approximated total processing rate in MiB / s.\n"
		<< ((m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) ? ("Note that index array size is not included in the processed size.\n") : (""))
		<< "Note! Test result should only be used as a baseline reference result for buffer.data_upload.* test group results."
		<< tcu::TestLog::EndMessage;
}